

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O2

Vector __thiscall Vector::Cross(Vector *this,Vector *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector VVar5;
  
  fVar1 = (float)*(undefined8 *)this->m_vec;
  fVar2 = (float)((ulong)*(undefined8 *)this->m_vec >> 0x20);
  fVar3 = (float)*(undefined8 *)v->m_vec;
  fVar4 = (float)((ulong)*(undefined8 *)v->m_vec >> 0x20);
  VVar5.m_vec[0] = fVar2 * v->m_vec[2] - fVar4 * this->m_vec[2];
  VVar5.m_vec[1] = this->m_vec[2] * fVar3 - v->m_vec[2] * fVar1;
  VVar5.m_length = -1.0;
  VVar5.m_vec[2] = fVar1 * fVar4 - fVar3 * fVar2;
  return VVar5;
}

Assistant:

float Z() const { return m_vec[2]; }